

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  float fVar5;
  float fVar6;
  ImS16 IVar7;
  ImS16 IVar8;
  ImGuiID IVar9;
  ImGuiTabItemFlags IVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  ImGuiID IVar15;
  ImGuiTabItemFlags IVar16;
  int iVar17;
  int iVar18;
  ImGuiTabItem *pIVar19;
  uint uVar20;
  ImGuiTabItem *pIVar21;
  ImGuiTabItem item_tmp;
  
  pIVar19 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((pIVar19 != (ImGuiTabItem *)0x0) && ((pIVar19->Flags & 0x20U) == 0)) {
    pIVar21 = (tab_bar->Tabs).Data;
    uVar20 = (int)tab_bar->ReorderRequestDir + (int)(((long)pIVar19 - (long)pIVar21) / 0x24);
    if ((-1 < (int)uVar20) && ((int)uVar20 < (tab_bar->Tabs).Size)) {
      if (((pIVar21[uVar20].Flags & 0x20U) == 0) &&
         (((pIVar21[uVar20].Flags ^ pIVar19->Flags) & 0xc0U) == 0)) {
        pIVar21 = pIVar21 + uVar20;
        uVar1._0_2_ = pIVar19->IndexDuringLayout;
        uVar1._2_1_ = pIVar19->WantClose;
        uVar1._3_1_ = pIVar19->field_0x23;
        IVar15 = pIVar19->ID;
        IVar16 = pIVar19->Flags;
        iVar17 = pIVar19->LastFrameVisible;
        iVar18 = pIVar19->LastFrameSelected;
        fVar13 = pIVar19->Offset;
        fVar14 = pIVar19->Width;
        uVar2 = pIVar19->ContentWidth;
        uVar3 = pIVar19->NameOffset;
        uVar4 = pIVar19->BeginOrder;
        item_tmp.BeginOrder._1_1_ = (undefined1)((ushort)uVar4 >> 8);
        *(undefined4 *)((long)&pIVar19->BeginOrder + 1) =
             *(undefined4 *)((long)&pIVar21->BeginOrder + 1);
        IVar9 = pIVar21->ID;
        IVar10 = pIVar21->Flags;
        iVar11 = pIVar21->LastFrameVisible;
        iVar12 = pIVar21->LastFrameSelected;
        fVar5 = pIVar21->Width;
        fVar6 = pIVar21->ContentWidth;
        IVar7 = pIVar21->NameOffset;
        IVar8 = pIVar21->BeginOrder;
        pIVar19->Offset = pIVar21->Offset;
        pIVar19->Width = fVar5;
        pIVar19->ContentWidth = fVar6;
        pIVar19->NameOffset = IVar7;
        pIVar19->BeginOrder = IVar8;
        pIVar19->ID = IVar9;
        pIVar19->Flags = IVar10;
        pIVar19->LastFrameVisible = iVar11;
        pIVar19->LastFrameSelected = iVar12;
        *(uint *)((long)&pIVar21->BeginOrder + 1) = CONCAT31((int3)uVar1,item_tmp.BeginOrder._1_1_);
        pIVar21->Offset = fVar13;
        pIVar21->Width = fVar14;
        pIVar21->ContentWidth = (float)uVar2;
        pIVar21->NameOffset = uVar3;
        pIVar21->BeginOrder = uVar4;
        pIVar21->ID = IVar15;
        pIVar21->Flags = IVar16;
        pIVar21->LastFrameVisible = iVar17;
        pIVar21->LastFrameSelected = iVar18;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}